

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::substitute(Forth *this)

{
  ForthStack<unsigned_int> *pFVar1;
  char cVar2;
  size_type sVar3;
  uint uVar4;
  uint dst;
  uint uVar5;
  uint src;
  size_type sVar6;
  size_type sVar7;
  iterator iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ulong uVar10;
  char cVar11;
  long lVar12;
  uint local_104;
  string Word2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Base_ptr local_b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a8;
  Forth *local_a0;
  ForthStack<unsigned_int> *local_98;
  string keyUpper;
  string Word1;
  string key;
  
  requireDStackDepth(this,4,"SUBSTITUTE");
  pFVar1 = &this->dStack;
  uVar4 = ForthStack<unsigned_int>::getTop(pFVar1);
  ForthStack<unsigned_int>::pop(pFVar1);
  dst = ForthStack<unsigned_int>::getTop(pFVar1);
  uVar5 = ForthStack<unsigned_int>::getTop(pFVar1,1);
  local_98 = pFVar1;
  src = ForthStack<unsigned_int>::getTop(pFVar1,2);
  Word1._M_dataplus._M_p = (pointer)&Word1.field_2;
  Word1._M_string_length = 0;
  Word1.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&Word1,src,(ulong)uVar5);
  sVar3 = Word1._M_string_length;
  Word2._M_dataplus._M_p = (pointer)&Word2.field_2;
  Word2._M_string_length = 0;
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  lVar12 = 0;
  Word2.field_2._M_local_buf[0] = '\0';
  key.field_2._M_local_buf[0] = '\0';
  keyUpper._M_dataplus._M_p = (pointer)&keyUpper.field_2;
  keyUpper._M_string_length = 0;
  keyUpper.field_2._M_local_buf[0] = '\0';
  local_a8 = &this->replacesSubstitute;
  local_b0 = &(this->replacesSubstitute)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_104 = 0;
  local_a0 = this;
  do {
    uVar10 = (ulong)(int)lVar12;
    if (sVar3 < uVar10 || sVar3 - uVar10 == 0) {
LAB_0010f76d:
      pFVar1 = local_98;
      uVar5 = 0xffffffff;
      if (Word2._M_string_length <= uVar4) {
        moveIntoDataSpace(local_a0,dst,Word2._M_dataplus._M_p,Word2._M_string_length);
        ForthStack<unsigned_int>::setTop(pFVar1,1,(uint)Word2._M_string_length);
        ForthStack<unsigned_int>::setTop(pFVar1,2,dst);
        uVar5 = local_104;
      }
      uVar4 = 0xffffffff;
      if (-1 < (int)uVar5) {
        uVar4 = uVar5;
      }
      ForthStack<unsigned_int>::setTop(pFVar1,uVar4);
      std::__cxx11::string::~string((string *)&keyUpper);
      std::__cxx11::string::~string((string *)&key);
      std::__cxx11::string::~string((string *)&Word2);
      std::__cxx11::string::~string((string *)&Word1);
      return;
    }
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&Word1,'%',uVar10);
    if (sVar6 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_d0,&Word1,uVar10,sVar3 - uVar10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&Word2,&local_d0);
LAB_0010f763:
      std::__cxx11::string::~string((string *)&local_d0);
      goto LAB_0010f76d;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_d0,&Word1,uVar10,sVar6 - uVar10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&Word2,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    uVar10 = (ulong)((int)sVar6 + 1);
    if (sVar3 < uVar10 || sVar3 - uVar10 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&Word2,"%");
      goto LAB_0010f76d;
    }
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&Word1,'%',uVar10);
    if (sVar7 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&Word2,"%");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_d0,&Word1,uVar10,sVar3 - uVar10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&Word2,&local_d0);
      goto LAB_0010f763;
    }
    if (sVar7 - uVar10 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&Word2,"%");
      lVar12 = sVar6 + 2;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_d0,&Word1,uVar10,sVar7 - uVar10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&key,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&keyUpper,&key);
      for (sVar6 = 0; keyUpper._M_string_length != sVar6; sVar6 = sVar6 + 1) {
        cVar2 = keyUpper._M_dataplus._M_p[sVar6];
        cVar11 = cVar2 + -0x20;
        if (0x19 < (byte)(cVar2 + 0x9fU)) {
          cVar11 = cVar2;
        }
        keyUpper._M_dataplus._M_p[sVar6] = cVar11;
      }
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_a8->_M_t,&keyUpper);
      if (iVar8._M_node == local_b0) {
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&Word2,"%");
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(pbVar9,&key);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (pbVar9,"%");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&Word2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (iVar8._M_node + 2));
        local_104 = local_104 + 1;
      }
      lVar12 = sVar7 + 1;
    }
  } while( true );
}

Assistant:

void substitute(){
			REQUIRE_DSTACK_DEPTH(4, "SUBSTITUTE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); ;
			auto length1 = dStack.getTop(1); ;
			auto caddr1 = CADDR(dStack.getTop(2));; 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{}, key{}, keyUpper{};
			auto result = 0;
			auto processedIt=0;
			auto processEnd=Word1.size();
			// start processing of Word1
			while(processedIt<processEnd){
				//auto nextPercent=std::find(processedIt,processEnd,'%');
				auto nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// copy chars to buffer and exit from loop
					Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					break;	
				}
				// copy chars before percent char
				Word2.append(Word1.substr(processedIt,nextPercent-processedIt));
				processedIt=nextPercent+1;
				if(processedIt>=processEnd) {
					Word2.append("%");
					break;
				} 
				nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// unclosed percent chars - everything copied to the buffer
					 Word2.append("%");
					 Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					 break;
				}
				if(nextPercent==processedIt){
					// two percents replaced by one percent
					Word2.append("%");
					++processedIt;
					continue;
				}
				key=Word1.substr(processedIt,nextPercent-processedIt);
				keyUpper=key;
				for(auto &c : keyUpper) c=toupper_ascii(c);
				auto foundIt=replacesSubstitute.find(keyUpper);
				if(foundIt==replacesSubstitute.end()){
					Word2.append("%").append(key).append("%");
				} else {
				 Word2.append((*foundIt).second);
				 ++result;
				}
				processedIt=nextPercent+1;
			}
			if(Word2.size()> length2) {
				result=-1;
			} else {
				moveIntoDataSpace( caddr2, Word2.c_str(), CELL(Word2.size()));
				dStack.setTop(1, CELL(Word2.size()) );
				dStack.setTop(2, CELL(caddr2) );

			}
			dStack.setTop((result < 0) ? -1 : result ); 
		}